

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMXPathExpressionImpl.cpp
# Opt level: O1

DOMXPathResult * __thiscall
xercesc_4_0::DOMXPathExpressionImpl::evaluate
          (DOMXPathExpressionImpl *this,DOMNode *contextNode,ResultType type,DOMXPathResult *result)

{
  long *plVar1;
  DOMXPathResultImpl *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLCh *rawName;
  undefined4 extraout_var_00;
  DOMElement *node;
  undefined4 extraout_var_01;
  DOMException *pDVar4;
  code *pcVar5;
  pointer_____offset_0x10___ *ppuVar6;
  JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> r_cleanup;
  XPathMatcher matcher;
  QName qName;
  SchemaElementDecl elemDecl;
  JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> local_180;
  RefVectorOf<xercesc_4_0::XMLAttr> local_168;
  XPathMatcher local_138;
  QName local_f0;
  SchemaElementDecl local_a8;
  
  if (type + ~FIRST_ORDERED_NODE_TYPE < 0xfffffffc) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMXPathException::DOMXPathException((DOMXPathException *)pDVar4,0x34,0,this->fMemoryManager);
    ppuVar6 = &DOMXPathException::typeinfo;
    pcVar5 = DOMXPathException::~DOMXPathException;
  }
  else {
    if ((contextNode != (DOMNode *)0x0) &&
       (iVar3 = (*contextNode->_vptr_DOMNode[4])(contextNode), iVar3 == 1)) {
      local_180.fObject = (DOMXPathResultImpl *)0x0;
      local_180.fToCall = 0x71;
      local_180._16_8_ = 0;
      if (result == (DOMXPathResult *)0x0) {
        result = (DOMXPathResult *)XMemory::operator_new(0x28,this->fMemoryManager);
        DOMXPathResultImpl::DOMXPathResultImpl
                  ((DOMXPathResultImpl *)result,type,this->fMemoryManager);
        pDVar2 = (DOMXPathResultImpl *)result;
        if ((local_180.fObject != (DOMXPathResultImpl *)0x0) &&
           (pDVar2 = (DOMXPathResultImpl *)result, (code *)local_180.fToCall != (code *)0x0)) {
          pcVar5 = (code *)local_180.fToCall;
          if ((local_180.fToCall & 1) != 0) {
            pcVar5 = *(code **)(local_180.fToCall +
                               *(long *)((long)&((local_180.fObject)->super_DOMXPathResult).
                                                _vptr_DOMXPathResult + local_180._16_8_) + -1);
          }
          (*pcVar5)();
          pDVar2 = (DOMXPathResultImpl *)result;
        }
      }
      else {
        DOMXPathResultImpl::reset((DOMXPathResultImpl *)result,type);
        pDVar2 = local_180.fObject;
      }
      local_180.fObject = pDVar2;
      XPathMatcher::XPathMatcher(&local_138,this->fParsedExpression,this->fMemoryManager);
      XPathMatcher::startDocumentFragment(&local_138);
      if (this->fMoveToRoot == true) {
        iVar3 = (*contextNode->_vptr_DOMNode[0xc])(contextNode);
        plVar1 = (long *)(CONCAT44(extraout_var,iVar3) + 0x18);
        if (CONCAT44(extraout_var,iVar3) == 0) {
          pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(pDVar4,9,0,this->fMemoryManager);
          __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
        }
        rawName = (XMLCh *)(**(code **)(*plVar1 + 0x10))(plVar1);
        QName::QName(&local_f0,rawName,0,this->fMemoryManager);
        SchemaElementDecl::SchemaElementDecl
                  (&local_a8,&local_f0,Any,0xfffffffe,XMLPlatformUtils::fgMemoryManager);
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager = this->fMemoryManager;
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>._vptr_BaseRefVectorOf =
             (_func_int **)&PTR__BaseRefVectorOf_00412e50;
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fAdoptedElems = true;
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fCurCount = 0;
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMaxCount = 0;
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fElemList = (XMLAttr **)0x0;
        iVar3 = (*(local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager)->
                  _vptr_MemoryManager[3])
                          (local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager,0);
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fElemList =
             (XMLAttr **)CONCAT44(extraout_var_00,iVar3);
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>._vptr_BaseRefVectorOf =
             (_func_int **)&PTR__RefVectorOf_00412dd8;
        XPathMatcher::startElement
                  (&local_138,&local_a8.super_XMLElementDecl,0,L"",&local_168,0,
                   (ValidationContext *)0x0);
        node = (DOMElement *)(**(code **)(*plVar1 + 0x38))(plVar1);
        while (node != (DOMElement *)0x0) {
          iVar3 = (*(node->super_DOMNode)._vptr_DOMNode[4])(node);
          if (iVar3 == 1) {
            testNode(this,&local_138,(DOMXPathResultImpl *)result,node);
          }
          iVar3 = (*(node->super_DOMNode)._vptr_DOMNode[10])(node);
          node = (DOMElement *)CONCAT44(extraout_var_01,iVar3);
        }
        XPathMatcher::endElement
                  (&local_138,&local_a8.super_XMLElementDecl,L"",(ValidationContext *)0x0,
                   (DatatypeValidator *)0x0);
        RefVectorOf<xercesc_4_0::XMLAttr>::~RefVectorOf(&local_168);
        SchemaElementDecl::~SchemaElementDecl(&local_a8);
        QName::~QName(&local_f0);
      }
      else {
        testNode(this,&local_138,(DOMXPathResultImpl *)result,(DOMElement *)contextNode);
      }
      local_180.fObject = (DOMXPathResultImpl *)0x0;
      XPathMatcher::~XPathMatcher(&local_138);
      JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl>::~JanitorMemFunCall(&local_180);
      return &((DOMXPathResultImpl *)result)->super_DOMXPathResult;
    }
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(pDVar4,9,0,this->fMemoryManager);
    ppuVar6 = &DOMException::typeinfo;
    pcVar5 = DOMException::~DOMException;
  }
  __cxa_throw(pDVar4,ppuVar6,pcVar5);
}

Assistant:

DOMXPathResult* DOMXPathExpressionImpl::evaluate(const DOMNode *contextNode,
                                                 DOMXPathResult::ResultType type,
                                                 DOMXPathResult* result) const
{
    if(type!=DOMXPathResult::FIRST_ORDERED_NODE_TYPE && type!=DOMXPathResult::ORDERED_NODE_SNAPSHOT_TYPE &&
       type!=DOMXPathResult::ANY_UNORDERED_NODE_TYPE && type!=DOMXPathResult::UNORDERED_NODE_SNAPSHOT_TYPE)
        throw DOMXPathException(DOMXPathException::TYPE_ERR, 0, fMemoryManager);

    if(contextNode==NULL || contextNode->getNodeType()!=DOMNode::ELEMENT_NODE)
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

    JanitorMemFunCall<DOMXPathResultImpl> r_cleanup (
      0, &DOMXPathResultImpl::release);
    DOMXPathResultImpl* r=(DOMXPathResultImpl*)result;
    if(r==NULL)
    {
      r=new (fMemoryManager) DOMXPathResultImpl(type, fMemoryManager);
      r_cleanup.reset (r);
    }
    else
        r->reset(type);

    XPathMatcher matcher(fParsedExpression, fMemoryManager);
    matcher.startDocumentFragment();

    if(fMoveToRoot)
    {
        contextNode=contextNode->getOwnerDocument();
        if(contextNode==NULL)
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

        QName qName(contextNode->getNodeName(), 0, fMemoryManager);
        SchemaElementDecl elemDecl(&qName);
        RefVectorOf<XMLAttr> attrList(0, true, fMemoryManager);
        matcher.startElement(elemDecl, 0, XMLUni::fgZeroLenString, attrList, 0);
        DOMNode* child=contextNode->getFirstChild();
        while(child)
        {
            if(child->getNodeType()==DOMNode::ELEMENT_NODE)
                testNode(&matcher, r, (DOMElement*)child);
            child=child->getNextSibling();
        }
        matcher.endElement(elemDecl, XMLUni::fgZeroLenString);
    }
    else
        testNode(&matcher, r, (DOMElement*)contextNode);

    r_cleanup.release ();
    return r;
}